

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
          (WastParser *this,Location loc,Token *token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *this_00;
  LoadStoreExpr<(wabt::ExprType)4> *this_01;
  Address local_34;
  uint32_t local_30;
  uint32_t align;
  uint32_t offset;
  Opcode opcode;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  Token *token_local;
  WastParser *this_local;
  
  _offset = out_expr;
  align = (uint32_t)Token::opcode(token);
  ParseOffsetOpt(this,&local_30);
  ParseAlignOpt(this,&local_34);
  this_00 = _offset;
  this_01 = (LoadStoreExpr<(wabt::ExprType)4> *)operator_new(0x48);
  LoadStoreExpr<(wabt::ExprType)4>::LoadStoreExpr(this_01,(Opcode)align,local_34,local_30,&loc);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset(this_00,(pointer)this_01);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainLoadStoreInstr(Location loc,
                                            Token token,
                                            std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  uint32_t offset;
  uint32_t align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, align, offset, loc));
  return Result::Ok;
}